

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::InputLessPGMController::signal_input_less_pgm(InputLessPGMController *this)

{
  bool bVar1;
  uint64_t uVar2;
  P *this_00;
  InputLessPGMOverlay *this_01;
  View *pVVar3;
  _Mem *this_02;
  TimeJob *j;
  long lVar4;
  float fVar5;
  float fVar6;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> guard;
  Group *host;
  InputLessPGMOverlay *overlay;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> reductionGuard;
  InputLessPGMController *this_local;
  
  reductionGuard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            (&local_18,
             &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex);
  uVar2 = r_code::list<core::P<r_exec::Overlay>_>::size
                    (&(this->super__PGMController).super_OController.overlays);
  if (uVar2 != 0) {
    this_00 = (P *)r_code::list<core::P<r_exec::Overlay>_>::front
                             (&(this->super__PGMController).super_OController.overlays);
    this_01 = core::P::operator_cast_to_InputLessPGMOverlay_(this_00);
    InputLessPGMOverlay::inject_productions(this_01);
    (*(this_01->super_Overlay).super__Object._vptr__Object[2])();
    if ((((this->super__PGMController).run_once & 1U) == 0) &&
       (bVar1 = Controller::is_alive((Controller *)this), bVar1)) {
      pVVar3 = Controller::getView((Controller *)this);
      guard._M_device = (mutex_type *)View::get_host(pVVar3);
      std::lock_guard<std::mutex>::lock_guard(&local_40,&this->m_hostMutex);
      fVar5 = Group::get_c_act((Group *)guard._M_device);
      fVar6 = Group::get_c_act_thr((Group *)guard._M_device);
      if (fVar6 < fVar5) {
        fVar5 = Group::get_c_sln((Group *)guard._M_device);
        fVar6 = Group::get_c_sln_thr((Group *)guard._M_device);
        if (fVar6 < fVar5) {
          this_02 = _Mem::Get();
          j = (TimeJob *)operator_new(0x28);
          pVVar3 = (View *)(this->super__PGMController).super_OController.super_Controller.view;
          lVar4 = (*Now)();
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)j,pVVar3,
                     lVar4 + (this->super__PGMController).super_OController.super_Controller.tsc);
          _Mem::pushTimeJob(this_02,j);
        }
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_40);
    }
  }
  if (((this->super__PGMController).run_once & 1U) != 0) {
    (*(this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object[3]
    )();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void InputLessPGMController::signal_input_less_pgm()
{
    std::lock_guard<std::mutex> reductionGuard(m_reductionMutex);

    if (overlays.size()) {
        InputLessPGMOverlay *overlay = (InputLessPGMOverlay *)overlays.front();
        overlay->inject_productions();
        overlay->reset();

        if (!run_once) {
            if (is_alive()) {
                Group *host = getView()->get_host();
                std::lock_guard<std::mutex> guard(m_hostMutex);

                if (host->get_c_act() > host->get_c_act_thr() && // c-active group.
                    host->get_c_sln() > host->get_c_sln_thr()) { // c-salient group.
                    _Mem::Get()->pushTimeJob(new InputLessPGMSignalingJob((r_exec::View*)view, Now() + tsc));
                }
            }
        }
    }

    if (run_once) {
        invalidate();
    }
}